

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_cnv.cpp
# Opt level: O2

UChar * u_uastrncpy_63(UChar *ucs1,char *s2,int32_t n)

{
  int32_t iVar1;
  UConverter *converter;
  UChar *pUVar2;
  long lVar3;
  UErrorCode err;
  UChar *target;
  char *s2_local;
  
  err = U_ZERO_ERROR;
  target = ucs1;
  s2_local = s2;
  converter = u_getDefaultConverter_63(&err);
  pUVar2 = ucs1;
  if (converter != (UConverter *)0x0 && err < U_ILLEGAL_ARGUMENT_ERROR) {
    ucnv_reset_63(converter);
    if (s2 == (char *)0x0) {
      lVar3 = 0;
    }
    else {
      for (lVar3 = 0; (iVar1 = n, n != (int)lVar3 && (iVar1 = (int)lVar3, s2[lVar3] != '\0'));
          lVar3 = lVar3 + 1) {
      }
      lVar3 = (long)iVar1;
    }
    ucnv_toUnicode_63(converter,&target,ucs1 + n,&s2_local,s2 + lVar3,(int32_t *)0x0,'\x01',&err);
    ucnv_reset_63(converter);
    u_releaseDefaultConverter_63(converter);
    if (err != U_BUFFER_OVERFLOW_ERROR && U_ZERO_ERROR < err) {
      *ucs1 = L'\0';
    }
    pUVar2 = target;
    if (ucs1 + n <= target) {
      return ucs1;
    }
  }
  *pUVar2 = L'\0';
  return ucs1;
}

Assistant:

U_CAPI UChar*  U_EXPORT2
u_uastrncpy(UChar *ucs1,
           const char *s2,
           int32_t n)
{
  UChar *target = ucs1;
  UErrorCode err = U_ZERO_ERROR;
  UConverter *cnv = u_getDefaultConverter(&err);
  if(U_SUCCESS(err) && cnv != NULL) {
    ucnv_reset(cnv);
    ucnv_toUnicode(cnv,
                   &target,
                   ucs1+n,
                   &s2,
                   s2+u_astrnlen(s2, n),
                   NULL,
                   TRUE,
                   &err);
    ucnv_reset(cnv); /* be good citizens */
    u_releaseDefaultConverter(cnv);
    if(U_FAILURE(err) && (err != U_BUFFER_OVERFLOW_ERROR) ) {
      *ucs1 = 0; /* failure */
    }
    if(target < (ucs1+n)) { /* U_BUFFER_OVERFLOW_ERROR isn't an err, just means no termination will happen. */
      *target = 0;  /* terminate */
    }
  } else {
    *ucs1 = 0;
  }
  return ucs1;
}